

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

int zip_resolve(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  ZipResolveType ZVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint16 ui16;
  PHYSFS_uint32 ui32;
  PHYSFS_uint16 extralen;
  PHYSFS_uint16 fnamelen;
  PHYSFS_uint16 local_2a;
  PHYSFS_uint32 local_28;
  ushort local_24;
  ushort local_22;
  
  ZVar1 = entry->resolved;
  iVar4 = 1;
  switch(ZVar1) {
  case ZIP_RESOLVING:
    errcode = PHYSFS_ERR_SYMLINK_LOOP;
    break;
  case ZIP_RESOLVED:
  case ZIP_DIRECTORY:
    goto switchD_00116f94_caseD_3;
  case ZIP_BROKEN_FILE:
  case ZIP_BROKEN_SYMLINK:
    errcode = PHYSFS_ERR_CORRUPT;
    break;
  default:
    if ((entry->tree).isdir != 0) {
      entry->resolved = ZIP_DIRECTORY;
      return 1;
    }
    iVar4 = (*io->seek)(io,entry->offset);
    if ((iVar4 == 0) || (iVar4 = readui32(io,&local_28), iVar4 == 0)) {
LAB_00117133:
      bVar3 = false;
      iVar4 = 0;
    }
    else {
      if (local_28 != 0x4034b50) {
LAB_00117129:
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        goto LAB_00117133;
      }
      iVar4 = readui16(io,&local_2a);
      if (iVar4 == 0) goto LAB_00117133;
      if (local_2a != entry->version_needed) goto LAB_00117129;
      iVar4 = readui16(io,&local_2a);
      if ((iVar4 == 0) || (iVar4 = readui16(io,&local_2a), iVar4 == 0)) goto LAB_00117133;
      if (local_2a != entry->compression_method) goto LAB_00117129;
      iVar4 = readui32(io,&local_28);
      if ((iVar4 == 0) || (iVar4 = readui32(io,&local_28), iVar4 == 0)) goto LAB_00117133;
      if ((local_28 != 0) && (local_28 != entry->crc)) goto LAB_00117129;
      iVar4 = readui32(io,&local_28);
      if (iVar4 == 0) goto LAB_00117133;
      if ((local_28 - 1 < 0xfffffffe) && (entry->compressed_size != (ulong)local_28))
      goto LAB_00117129;
      iVar4 = readui32(io,&local_28);
      if (iVar4 == 0) goto LAB_00117133;
      if ((local_28 - 1 < 0xfffffffe) && (entry->uncompressed_size != (ulong)local_28))
      goto LAB_00117129;
      iVar4 = readui16(io,&local_22);
      if ((iVar4 == 0) || (iVar4 = readui16(io,&local_24), iVar4 == 0)) goto LAB_00117133;
      entry->offset = entry->offset + (ulong)local_24 + (ulong)local_22 + 0x1e;
      iVar4 = 1;
      bVar3 = true;
    }
    if (bVar3 && ZVar1 == ZIP_UNRESOLVED_SYMLINK) {
      iVar4 = zip_resolve_symlink(io,info,entry);
    }
    if (ZVar1 == ZIP_UNRESOLVED_SYMLINK) {
      iVar2 = (uint)(iVar4 == 0) * 3;
    }
    else {
      if (ZVar1 != ZIP_UNRESOLVED_FILE) {
        return iVar4;
      }
      iVar2 = (uint)(iVar4 == 0) * 2;
    }
    entry->resolved = iVar2 + ZIP_RESOLVED;
    goto switchD_00116f94_caseD_3;
  }
  PHYSFS_setErrorCode(errcode);
  iVar4 = 0;
switchD_00116f94_caseD_3:
  return iVar4;
}

Assistant:

static int zip_resolve(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    int retval = 1;
    const ZipResolveType resolve_type = entry->resolved;

    if (resolve_type == ZIP_DIRECTORY)
        return 1;   /* we're good. */

    /* Don't bother if we've failed to resolve this entry before. */
    BAIL_IF(resolve_type == ZIP_BROKEN_FILE, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF(resolve_type == ZIP_BROKEN_SYMLINK, PHYSFS_ERR_CORRUPT, 0);

    /* uhoh...infinite symlink loop! */
    BAIL_IF(resolve_type == ZIP_RESOLVING, PHYSFS_ERR_SYMLINK_LOOP, 0);

    /*
     * We fix up the offset to point to the actual data on the
     *  first open, since we don't want to seek across the whole file on
     *  archive open (can be SLOW on large, CD-stored files), but we
     *  need to check the local file header...not just for corruption,
     *  but since it stores offset info the central directory does not.
     */
    if (resolve_type != ZIP_RESOLVED)
    {
        if (entry->tree.isdir)  /* an ancestor dir that DirTree filled in? */
        {
            entry->resolved = ZIP_DIRECTORY;
            return 1;
        } /* if */

        retval = zip_parse_local(io, entry);
        if (retval)
        {
            /*
             * If it's a symlink, find the original file. This will cause
             *  resolution of other entries (other symlinks and, eventually,
             *  the real file) if all goes well.
             */
            if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
                retval = zip_resolve_symlink(io, info, entry);
        } /* if */

        if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_SYMLINK);
        else if (resolve_type == ZIP_UNRESOLVED_FILE)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_FILE);
    } /* if */

    return retval;
}